

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

bool __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::step_push
          (xpath_ast_node *this,xpath_node_set_raw *ns,xml_attribute_struct *a,
          xml_node_struct *parent,xpath_allocator *alloc)

{
  xml_attribute_struct *pxVar1;
  bool bVar2;
  undefined1 uVar3;
  long lVar4;
  char cVar5;
  xpath_allocator *in_R9;
  char *src;
  xpath_node local_48;
  xml_node local_38;
  xml_attribute local_30;
  
  if (parent == (xml_node_struct *)0x0) {
    __assert_fail("a",
                  "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/pugixml/src/pugixml.cpp"
                  ,0x2659,
                  "bool pugi::impl::(anonymous namespace)::xpath_ast_node::step_push(xpath_node_set_raw &, xml_attribute_struct *, xml_node_struct *, xpath_allocator *)"
                 );
  }
  src = "";
  if (parent->name != (char_t *)0x0) {
    src = parent->name;
  }
  bVar2 = false;
  switch((uint)this & 0xff) {
  case 1:
    bVar2 = strequal(src,(char_t *)ns);
    if (!bVar2) {
      return false;
    }
    cVar5 = 'x';
    lVar4 = 0;
    do {
      if (src[lVar4] != cVar5) goto LAB_001924ee;
      cVar5 = "xmlns"[lVar4 + 1];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 5);
    break;
  case 2:
  case 7:
    cVar5 = 'x';
    lVar4 = 0;
    do {
      if (src[lVar4] != cVar5) goto LAB_001924ee;
      cVar5 = "xmlns"[lVar4 + 1];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 5);
    break;
  default:
    goto switchD_00192449_caseD_3;
  case 8:
    uVar3 = (undefined1)ns->_type;
    if (uVar3 != type_unsorted) {
      lVar4 = 0;
      do {
        if (src[lVar4] != uVar3) {
          return false;
        }
        uVar3 = *(char *)((long)&ns->_type + lVar4 + 1);
        lVar4 = lVar4 + 1;
      } while (uVar3 != type_unsorted);
    }
    cVar5 = 'x';
    lVar4 = 0;
    do {
      if (src[lVar4] != cVar5) goto LAB_001924ee;
      cVar5 = "xmlns"[lVar4 + 1];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 5);
  }
  bVar2 = false;
  if ((src[5] != '\0') && (bVar2 = false, src[5] != ':')) {
LAB_001924ee:
    xml_attribute::xml_attribute(&local_30,(xml_attribute_struct *)parent);
    xml_node::xml_node(&local_38,(xml_node_struct *)alloc);
    xpath_node::xpath_node(&local_48,&local_30,&local_38);
    pxVar1 = (xml_attribute_struct *)a->value;
    if (pxVar1 == a->prev_attribute_c) {
      xpath_node_set_raw::push_back_grow((xpath_node_set_raw *)a,&local_48,in_R9);
    }
    else {
      a->value = (char_t *)&pxVar1->value;
      pxVar1->header = (uintptr_t)local_48._node._root;
      pxVar1->name = (char_t *)local_48._attribute._attr;
    }
    bVar2 = true;
  }
switchD_00192449_caseD_3:
  return bVar2;
}

Assistant:

bool step_push(xpath_node_set_raw& ns, xml_attribute_struct* a, xml_node_struct* parent, xpath_allocator* alloc)
		{
			assert(a);

			const char_t* name = a->name ? a->name + 0 : PUGIXML_TEXT("");

			switch (_test)
			{
			case nodetest_name:
				if (strequal(name, _data.nodetest) && is_xpath_attribute(name))
				{
					ns.push_back(xpath_node(xml_attribute(a), xml_node(parent)), alloc);
					return true;
				}
				break;

			case nodetest_type_node:
			case nodetest_all:
				if (is_xpath_attribute(name))
				{
					ns.push_back(xpath_node(xml_attribute(a), xml_node(parent)), alloc);
					return true;
				}
				break;

			case nodetest_all_in_namespace:
				if (starts_with(name, _data.nodetest) && is_xpath_attribute(name))
				{
					ns.push_back(xpath_node(xml_attribute(a), xml_node(parent)), alloc);
					return true;
				}
				break;

			default:
				;
			}

			return false;
		}